

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *this,
          RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *AutoPtr)

{
  BottomLevelASVkImpl *this_00;
  
  this_00 = AutoPtr->m_pObject;
  this->m_pObject = this_00;
  if (this_00 != (BottomLevelASVkImpl *)0x0) {
    RefCountedObject<Diligent::IBottomLevelASVk>::AddRef
              ((RefCountedObject<Diligent::IBottomLevelASVk> *)this_00);
  }
  return;
}

Assistant:

RefCntAutoPtr(const RefCntAutoPtr& AutoPtr) noexcept :
        m_pObject{AutoPtr.m_pObject}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }